

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labelling.cc
# Opt level: O0

Label * labelling::processBwdLabel
                  (Label *label,vector<double,_std::allocator<double>_> *max_res,
                  vector<double,_std::allocator<double>_> *cumulative_resource,bool *invert_min_res)

{
  Vertex *vertex_in;
  const_reference pvVar1;
  reference pvVar2;
  iterator iVar3;
  vector<double,_std::allocator<double>_> *in_RDX;
  long in_RSI;
  Label *in_RDI;
  byte *in_R8;
  vector<double,_std::allocator<double>_> *this;
  int *c_res;
  vector<double,_std::allocator<double>_> new_resources;
  vector<int,_std::allocator<int>_> new_path;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff18;
  vector<double,_std::allocator<double>_> *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff28;
  value_type vVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff30;
  const_iterator in_stack_ffffffffffffff68;
  iterator in_stack_ffffffffffffff70;
  iterator in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff88;
  Label *in_stack_ffffffffffffff90;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70._M_current,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff68._M_current);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff18);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff18);
  std::reverse<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff70._M_current,
             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff68._M_current);
  vertex_in = (Vertex *)(*(long *)(in_RSI + 0x70) + 0x3c);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     (in_RDX,(long)vertex_in->lemon_id);
  vVar4 = *pvVar1;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff88,
                      (long)vertex_in->lemon_id);
  this = (vector<double,_std::allocator<double>_> *)(vVar4 - *pvVar2);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff88,
                      (long)vertex_in->lemon_id);
  *pvVar2 = (value_type)this;
  if ((*in_R8 & 1) == 0) {
    this_00 = (vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff88;
    in_stack_ffffffffffffff78 = std::vector<double,_std::allocator<double>_>::begin(this_00);
    in_stack_ffffffffffffff70 = std::vector<double,_std::allocator<double>_>::end(this_00);
    in_stack_ffffffffffffff68 = std::vector<double,_std::allocator<double>_>::begin(this_00);
    iVar3 = std::vector<double,_std::allocator<double>_>::begin(this_00);
    std::
    transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::plus<double>>
              (in_stack_ffffffffffffff78._M_current,in_stack_ffffffffffffff70._M_current,
               in_stack_ffffffffffffff68._M_current,iVar3._M_current);
  }
  Label::Label(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,vertex_in,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff78._M_current,
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70._M_current,
               (Params *)in_stack_ffffffffffffff68._M_current);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  return in_RDI;
}

Assistant:

Label processBwdLabel(
    const labelling::Label&    label,
    const std::vector<double>& max_res,
    const std::vector<double>& cumulative_resource,
    const bool&                invert_min_res) {
  // Invert path
  std::vector<int> new_path = label.partial_path;
  std::reverse(new_path.begin(), new_path.end());
  // Init resources
  std::vector<double> new_resources(label.resource_consumption);
  // Invert monotone resource
  const int& c_res     = label.params_ptr->critical_res;
  new_resources[c_res] = max_res[c_res] - new_resources[c_res];

  if (!invert_min_res) {
    // Elementwise cumulative_resource + new_resources
    std::transform(
        new_resources.begin(),
        new_resources.end(),
        cumulative_resource.begin(),
        new_resources.begin(),
        std::plus<double>());
  }
  return Label(
      label.weight, label.vertex, new_resources, new_path, label.params_ptr);
}